

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# D5xNvmFlash.cpp
# Opt level: O3

void __thiscall D5xNvmFlash::writePage(D5xNvmFlash *this,uint32_t page)

{
  WordCopyApplet *this_00;
  bool *pbVar1;
  byte bVar2;
  byte bVar3;
  undefined8 *puVar4;
  uint32_t uVar5;
  
  if (page < (this->super_Flash)._pages) {
    bVar2 = Samba::readByte((this->super_Flash)._samba,0x41004000);
    bVar3 = Samba::readByte((this->super_Flash)._samba,0x41004001);
    Samba::writeByte((this->super_Flash)._samba,0x41004000,bVar2 & 0xcf);
    Samba::writeByte((this->super_Flash)._samba,0x41004001,bVar3 | 0xc0);
    if (((page & 0xf) == 0) && ((this->super_Flash).field_0xf4 != '\0')) {
      uVar5 = (this->super_Flash)._size;
      erase(this,uVar5 * page,uVar5 << 4);
    }
    command(this,'\x15');
    uVar5 = page * (this->super_Flash)._size + (this->super_Flash)._addr;
    this_00 = &(this->super_Flash)._wordCopy;
    WordCopyApplet::setDstAddr(this_00,uVar5);
    WordCopyApplet::setSrcAddr
              (this_00,(&(this->super_Flash)._pageBufferA)[(this->super_Flash)._onBufferA ^ 1]);
    WordCopyApplet::setWords(this_00,(this->super_Flash)._size >> 2);
    pbVar1 = &(this->super_Flash)._onBufferA;
    *pbVar1 = (bool)(*pbVar1 ^ 1);
    waitReady(this);
    Applet::runv(&this_00->super_Applet);
    Samba::writeWord((this->super_Flash)._samba,0x41004014,uVar5);
    command(this,'\x03');
    return;
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = &PTR__exception_001187a0;
  __cxa_throw(puVar4,&FlashPageError::typeinfo,std::exception::~exception);
}

Assistant:

void
D5xNvmFlash::writePage(uint32_t page)
{
    if (page >= _pages)
    {
        throw FlashPageError();
    }

    // Configure manual page write and disable caches
    writeRegU16(NVM_REG_CTRLA, (readRegU16(NVM_REG_CTRLA) | (0x3 << 14)) & 0xffcf);

    // Auto-erase if writing at the start of the erase page
    if (_eraseAuto && page % ERASE_BLOCK_PAGES == 0)
    {
        erase(page * _size, ERASE_BLOCK_PAGES * _size);
    }

    // Clear page bur
    command(NVM_CMD_PBC);

    uint32_t addr = _addr + (page * _size );

    _wordCopy.setDstAddr(addr);
    _wordCopy.setSrcAddr(_onBufferA ? _pageBufferA : _pageBufferB);
    _wordCopy.setWords(_size / sizeof(uint32_t));
    _onBufferA = !_onBufferA;
    waitReady();
    _wordCopy.runv();

    writeRegU32(NVM_REG_ADDR, addr);
    command(NVM_CMD_WP);
}